

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

vector<Pathie::Path,_std::allocator<Pathie::Path>_> * Pathie::Path::data_dirs(void)

{
  vector<Pathie::Path,_std::allocator<Pathie::Path>_> *in_RDI;
  allocator local_4a;
  allocator local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"XDG_DATA_DIRS",&local_49);
  std::__cxx11::string::string((string *)&local_48,"/usr/local/share/:/usr/share/",&local_4a);
  get_xdg_dirlist(in_RDI,&local_28,&local_48);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return in_RDI;
}

Assistant:

std::vector<Path> Path::data_dirs()
{
  return get_xdg_dirlist("XDG_DATA_DIRS", "/usr/local/share/:/usr/share/");
}